

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int z_deflateReset(z_streamp strm)

{
  deflate_state *s_00;
  int iVar1;
  z_uLong local_24;
  deflate_state *s;
  z_streamp strm_local;
  
  if ((((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) ||
      (strm->zalloc == (z_alloc_func)0x0)) || (strm->zfree == (z_free_func)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    strm->data_type = 2;
    s_00 = strm->state;
    s_00->pending = 0;
    s_00->pending_out = s_00->pending_buf;
    if (s_00->wrap < 0) {
      s_00->wrap = -s_00->wrap;
    }
    iVar1 = 0x71;
    if (s_00->wrap != 0) {
      iVar1 = 0x2a;
    }
    s_00->status = iVar1;
    if (s_00->wrap == 2) {
      local_24 = z_crc32(0,(uchar *)0x0,0);
    }
    else {
      local_24 = z_adler32(0,(z_Bytef *)0x0,0);
    }
    strm->adler = local_24;
    s_00->last_flush = 0;
    _tr_init(s_00);
    lm_init(s_00);
    strm_local._4_4_ = 0;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateReset (strm)
    z_streamp strm;
{
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0) {
        return Z_STREAM_ERROR;
    }

    strm->total_in = strm->total_out = 0;
    strm->msg = Z_NULL; /* use zfree if we ever allocate msg dynamically */
    strm->data_type = Z_UNKNOWN;

    s = (deflate_state *)strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;

    if (s->wrap < 0) {
        s->wrap = -s->wrap; /* was made negative by deflate(..., Z_FINISH); */
    }
    s->status = s->wrap ? INIT_STATE : BUSY_STATE;
    strm->adler =
#ifdef GZIP
        s->wrap == 2 ? crc32(0L, Z_NULL, 0) :
#endif
        adler32(0L, Z_NULL, 0);
    s->last_flush = Z_NO_FLUSH;

    _tr_init(s);
    lm_init(s);

    return Z_OK;
}